

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eps_copy_input_stream.h
# Opt level: O0

char * upb_EpsCopyInputStream_ReadString
                 (upb_EpsCopyInputStream *e,char **ptr,size_t size,upb_Arena *arena)

{
  _Bool _Var1;
  char *to;
  char *ret;
  char *data;
  upb_Arena *arena_local;
  size_t size_local;
  char **ptr_local;
  upb_EpsCopyInputStream *e_local;
  
  _Var1 = upb_EpsCopyInputStream_AliasingAvailable(e,*ptr,size);
  if (_Var1) {
    e_local = (upb_EpsCopyInputStream *)upb_EpsCopyInputStream_ReadStringAliased(e,ptr,size);
  }
  else {
    _Var1 = upb_EpsCopyInputStream_CheckDataSizeAvailable(e,*ptr,(int)size);
    if (_Var1) {
      if (arena == (upb_Arena *)0x0) {
        __assert_fail("arena",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/wire/eps_copy_input_stream.h"
                      ,299,
                      "const char *upb_EpsCopyInputStream_ReadString(upb_EpsCopyInputStream *, const char **, size_t, upb_Arena *)"
                     );
      }
      to = (char *)upb_Arena_Malloc(arena,size);
      if (to == (char *)0x0) {
        e_local = (upb_EpsCopyInputStream *)0x0;
      }
      else {
        e_local = (upb_EpsCopyInputStream *)upb_EpsCopyInputStream_Copy(e,*ptr,to,(int)size);
        *ptr = to;
      }
    }
    else {
      e_local = (upb_EpsCopyInputStream *)0x0;
    }
  }
  return (char *)e_local;
}

Assistant:

UPB_INLINE const char* upb_EpsCopyInputStream_ReadString(
    upb_EpsCopyInputStream* e, const char** ptr, size_t size,
    upb_Arena* arena) {
  if (upb_EpsCopyInputStream_AliasingAvailable(e, *ptr, size)) {
    return upb_EpsCopyInputStream_ReadStringAliased(e, ptr, size);
  } else {
    // We need to allocate and copy.
    if (!upb_EpsCopyInputStream_CheckDataSizeAvailable(e, *ptr, size)) {
      return NULL;
    }
    UPB_ASSERT(arena);
    char* data = (char*)upb_Arena_Malloc(arena, size);
    if (!data) return NULL;
    const char* ret = upb_EpsCopyInputStream_Copy(e, *ptr, data, size);
    *ptr = data;
    return ret;
  }
}